

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

var __thiscall
cs::make_cni<std::__cxx11::string(&)(cs::lang_error_const&)>
          (cs *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_lang_error_ptr
          *func,types type)

{
  cni local_20;
  types local_14;
  
  local_14 = type;
  local_20.mCni =
       cs_impl::cni::construct_helper<std::__cxx11::string(*)(cs::lang_error_const&)>::
       _construct<std::__cxx11::string(&)(cs::lang_error_const&),std::__cxx11::string,cs::lang_error_const&>
                 (func,(_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_lang_error_ptr
                        *)0x0);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}